

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall Interpreter::load(Interpreter *this)

{
  istream *piVar1;
  size_type __n;
  void *__dest;
  mapped_type *pmVar2;
  uint8_t opcode;
  map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
  *local_70;
  string str;
  Call local_48;
  
  local_70 = &this->operations;
  while( true ) {
    std::istream::read((char *)this->s,(long)&opcode);
    piVar1 = (istream *)this->s;
    if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) != 0) break;
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>(piVar1,(string *)&str);
    __n = str._M_string_length;
    __dest = malloc(str._M_string_length);
    memcpy(__dest,str._M_dataplus._M_p,__n);
    pmVar2 = std::
             map<unsigned_char,_void_(Interpreter::*)(void_*),_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_void_(Interpreter::*)(void_*)>_>_>
             ::operator[](local_70,&opcode);
    local_48.func = *pmVar2;
    local_48._8_8_ = pmVar2[1];
    local_48.data = __dest;
    std::vector<Interpreter::Call,_std::allocator<Interpreter::Call>_>::
    emplace_back<Interpreter::Call>(&this->callList,&local_48);
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

void Interpreter::load() {
    //load labels
    unsigned int curOp = 0;
/*    while (true) {
        uint8_t opcode;
        s->read((char *) &opcode, 1);

        if (!s->good())
            break;

        std::string str;
        getline(*s, str);

        if (opcode == op::LABEL) {
#ifdef I_DEBUG
            printf("loaded label: %i pointing to op#%i\n", *str.data(), curOp);
#endif
            labels[*(unsigned int *) str.data()] = curOp;
            continue;
        }

        curOp++;
    }
    s->clear();
    s->seekg(0, std::ios::beg);

    curOp = 0;*/
    while (true) {
        uint8_t opcode;
        s->read((char *) &opcode, 1);

        if (!s->good())
            break;

        std::string str;
        getline(*s, str);

/*        if (opcode == op::LABEL) {
*//*#ifdef I_DEBUG
            printf("loaded label: %i\n", *str.data());
#endif
            labels[*str.data()] = curOp;*//*
            continue;
        }*/

        unsigned long size = str.size() * sizeof(str[0]);
        void *dataMem = malloc(size);
        memcpy(dataMem, str.data(), size);
#ifdef I_DEBUG
        printf("loaded %i; data size: %i\n", opcode, (int) size);
#endif
        opFunc f = operations[opcode];
        callList.push_back(Call(f, dataMem));
    }
}